

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O0

void poly1305_mul(uint32_t *x,uint32_t *y)

{
  int iVar1;
  int local_74;
  uint32_t local_70;
  int j;
  uint32_t accum;
  int i;
  uint32_t r [17];
  uint32_t *y_local;
  uint32_t *x_local;
  
  for (j = 0; j < 0x11; j = j + 1) {
    local_70 = 0;
    for (local_74 = 0; iVar1 = j, local_74 <= j; local_74 = local_74 + 1) {
      local_70 = x[local_74] * y[j - local_74] + local_70;
    }
    while (local_74 = iVar1 + 1, local_74 < 0x11) {
      local_70 = x[local_74] * 0x140 * y[(j + 0x11) - local_74] + local_70;
      iVar1 = local_74;
    }
    (&accum)[j] = local_70;
  }
  poly1305_min_reduce(&accum);
  for (j = 0; j < 0x11; j = j + 1) {
    x[j] = (&accum)[j];
  }
  return;
}

Assistant:

static void poly1305_mul(uint32_t x[17],
                         const uint32_t y[17])
{
  uint32_t r[17];
  int i;

  for (i = 0; i < 17; i++)
  {
    uint32_t accum = 0;
    int j;

    for (j = 0; j <= i; j++)
      accum += x[j] * y[i - j];

    /* Add in carries.  These get shifted 130 bits
     * to the right, with a combination of byte indexing
     * and shifting (136 bits right, then 6 bits left).
     *
     * nb. 5 << 6 is made up of two parts:
     *   5: reduction of 2 ** 130 leaves a multiple 5
     *   shift 6 places left
     *     17 * 8: byte indexing shift (136 bits)
     *     130: desired shift
     */
    for (j = i + 1; j < 17; j++)
      accum += (5 << 6) * x[j] * y[i + 17 - j];

    r[i] = accum;
  }

  poly1305_min_reduce(r);

  for (i = 0; i < 17; i++)
    x[i] = r[i];
}